

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.cpp
# Opt level: O0

void writeBank(SortedSection *bankSections,uint16_t baseOffset,uint16_t size)

{
  Section *pSVar1;
  uint local_2c;
  uint local_28;
  ushort local_22;
  uint16_t i;
  Section *section;
  uint16_t offset;
  uint16_t size_local;
  SortedSection *pSStack_10;
  uint16_t baseOffset_local;
  SortedSection *bankSections_local;
  
  section._2_2_ = 0;
  pSStack_10 = bankSections;
  while( true ) {
    if (pSStack_10 == (SortedSection *)0x0) {
      if ((disablePadding & 1U) == 0) {
        for (; section._2_2_ < size; section._2_2_ = section._2_2_ + 1) {
          if (overlayFile == (FILE *)0x0) {
            local_2c = (uint)padValue;
          }
          else {
            local_2c = getc((FILE *)overlayFile);
          }
          putc(local_2c,(FILE *)outputFile);
        }
      }
      return;
    }
    pSVar1 = pSStack_10->section;
    if (pSVar1->offset != 0) break;
    for (; (uint)section._2_2_ + (uint)baseOffset < (uint)pSVar1->org;
        section._2_2_ = section._2_2_ + 1) {
      if (overlayFile == (FILE *)0x0) {
        local_28 = (uint)padValue;
      }
      else {
        local_28 = getc((FILE *)overlayFile);
      }
      putc(local_28,(FILE *)outputFile);
    }
    fwrite(pSVar1->data,1,(ulong)pSVar1->size,(FILE *)outputFile);
    if (overlayFile != (FILE *)0x0) {
      for (local_22 = 0; local_22 < pSVar1->size; local_22 = local_22 + 1) {
        getc((FILE *)overlayFile);
      }
    }
    section._2_2_ = section._2_2_ + pSVar1->size;
    pSStack_10 = pSStack_10->next;
  }
  __assert_fail("section->offset == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/link/output.cpp"
                ,0xcb,"writeBank");
}

Assistant:

static void writeBank(struct SortedSection *bankSections, uint16_t baseOffset,
		      uint16_t size)
{
	uint16_t offset = 0;

	while (bankSections) {
		struct Section const *section = bankSections->section;

		assert(section->offset == 0);
		// Output padding up to the next SECTION
		while (offset + baseOffset < section->org) {
			putc(overlayFile ? getc(overlayFile) : padValue, outputFile);
			offset++;
		}

		// Output the section itself
		fwrite(section->data, sizeof(*section->data), section->size,
		       outputFile);
		if (overlayFile) {
			// Skip bytes even with pipes
			for (uint16_t i = 0; i < section->size; i++)
				getc(overlayFile);
		}
		offset += section->size;

		bankSections = bankSections->next;
	}

	if (!disablePadding) {
		while (offset < size) {
			putc(overlayFile ? getc(overlayFile) : padValue, outputFile);
			offset++;
		}
	}
}